

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_leaf_add_leafref_target(lys_node_leaf *leafref_target,lys_node *leafref)

{
  ly_ctx *ctx;
  lys_node_leaf *plVar1;
  ly_set *set;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  
  ctx = leafref_target->module->ctx;
  if ((leafref_target->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
           ,0x102b);
LAB_00160c63:
    iVar4 = -1;
  }
  else {
    plVar1 = leafref_target;
    if (((*(char *)&leafref[1].parent != -1) && ((leafref->flags & 1) != 0)) &&
       ((leafref_target->flags & 2) != 0)) {
      pcVar2 = strnodetype(leafref->nodetype);
      pcVar3 = strnodetype(leafref_target->nodetype);
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,leafref,
              "The leafref %s is config but refers to a non-config %s.",pcVar2,pcVar3);
      return -1;
    }
    do {
      if ((plVar1->type).base != LY_TYPE_LEAFREF) break;
      if (plVar1 == (lys_node_leaf *)leafref) {
        ly_vlog(ctx,LYE_CIRC_LEAFREFS,LY_VLOG_LYS,leafref);
        goto LAB_00160c63;
      }
      plVar1 = (plVar1->type).info.lref.target;
    } while (plVar1 != (lys_node_leaf *)0x0);
    set = leafref_target->backlinks;
    if (set == (ly_set *)0x0) {
      set = ly_set_new();
      leafref_target->backlinks = set;
      if (set == (ly_set *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_leaf_add_leafref_target"
              );
        goto LAB_00160c63;
      }
    }
    iVar4 = 0;
    ly_set_add(set,leafref,0);
  }
  return iVar4;
}

Assistant:

int
lys_leaf_add_leafref_target(struct lys_node_leaf *leafref_target, struct lys_node *leafref)
{
    struct lys_node_leaf *iter;
    struct ly_ctx *ctx = leafref_target->module->ctx;

    if (!(leafref_target->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGINT(ctx);
        return -1;
    }

    /* check for config flag */
    if (((struct lys_node_leaf*)leafref)->type.info.lref.req != -1 &&
            (leafref->flags & LYS_CONFIG_W) && (leafref_target->flags & LYS_CONFIG_R)) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYS, leafref,
               "The leafref %s is config but refers to a non-config %s.",
               strnodetype(leafref->nodetype), strnodetype(leafref_target->nodetype));
        return -1;
    }
    /* check for cycles */
    for (iter = leafref_target; iter && iter->type.base == LY_TYPE_LEAFREF; iter = iter->type.info.lref.target) {
        if ((void *)iter == (void *)leafref) {
            /* cycle detected */
            LOGVAL(ctx, LYE_CIRC_LEAFREFS, LY_VLOG_LYS, leafref);
            return -1;
        }
    }

    /* create fake child - the ly_set structure to hold the list of
     * leafrefs referencing the leaf(-list) */
    if (!leafref_target->backlinks) {
        leafref_target->backlinks = (void *)ly_set_new();
        if (!leafref_target->backlinks) {
            LOGMEM(ctx);
            return -1;
        }
    }
    ly_set_add(leafref_target->backlinks, leafref, 0);

    return 0;
}